

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth_test.c
# Opt level: O1

REF_STATUS
ref_smooth_tet_two_fixture
          (REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,REF_INT *target_node,REF_INT *top_node)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  long lVar5;
  undefined8 uVar6;
  char *pcVar7;
  REF_INT node;
  REF_INT cell;
  REF_INT nodes [27];
  int local_b0;
  REF_INT local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  
  uVar4 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar4 == 0) {
    pRVar1 = *ref_grid_ptr;
    ref_node = pRVar1->node;
    uVar4 = ref_node_add(ref_node,0,&local_b0);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth_test.c"
             ,0xb8,"ref_smooth_tet_two_fixture",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar2 = ref_node->real;
    pRVar3 = pRVar2 + (long)local_b0 * 0xf;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    pRVar2[(long)local_b0 * 0xf + 2] = 0.0;
    local_a8 = local_b0;
    uVar4 = ref_node_add(ref_node,1,&local_b0);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth_test.c"
             ,0xbe,"ref_smooth_tet_two_fixture",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    pRVar3[(long)local_b0 * 0xf] = 1.0;
    pRVar3 = pRVar3 + (long)local_b0 * 0xf + 1;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    local_a4 = local_b0;
    uVar4 = ref_node_add(ref_node,2,&local_b0);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth_test.c"
             ,0xc4,"ref_smooth_tet_two_fixture",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar5 = (long)local_b0;
    pRVar3[lVar5 * 0xf] = 0.0;
    pRVar3[lVar5 * 0xf + 1] = 1.0;
    pRVar3[lVar5 * 0xf + 2] = 0.0;
    local_a0 = local_b0;
    uVar4 = ref_node_add(ref_node,3,&local_b0);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth_test.c"
             ,0xca,"ref_smooth_tet_two_fixture",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar5 = (long)local_b0;
    pRVar3[lVar5 * 0xf] = 1.0;
    pRVar3[lVar5 * 0xf + 1] = 0.0;
    pRVar3[lVar5 * 0xf + 2] = 1.0;
    local_9c = local_b0;
    *target_node = local_b0;
    uVar4 = ref_cell_add(pRVar1->cell[8],&local_a8,&local_ac);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth_test.c"
             ,0xd2,"ref_smooth_tet_two_fixture",(ulong)uVar4,"add tri");
      return uVar4;
    }
    local_a4 = local_a0;
    uVar4 = ref_node_add(ref_node,4,&local_b0);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth_test.c"
             ,0xd6,"ref_smooth_tet_two_fixture",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar2 = ref_node->real;
    pRVar3 = pRVar2 + (long)local_b0 * 0xf;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    pRVar2[(long)local_b0 * 0xf + 2] = 1.0;
    local_a0 = local_b0;
    *top_node = local_b0;
    uVar4 = ref_cell_add(pRVar1->cell[8],&local_a8,&local_ac);
    if (uVar4 == 0) {
      return 0;
    }
    pcVar7 = "add tri";
    uVar6 = 0xde;
  }
  else {
    pcVar7 = "grid";
    uVar6 = 0xb2;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth_test.c",
         uVar6,"ref_smooth_tet_two_fixture",(ulong)uVar4,pcVar7);
  return uVar4;
}

Assistant:

REF_FCN static REF_STATUS ref_smooth_tet_two_fixture(REF_GRID *ref_grid_ptr,
                                                     REF_MPI ref_mpi,
                                                     REF_INT *target_node,
                                                     REF_INT *top_node) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT node;
  REF_INT cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "grid");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  /* 0-1-2 base, 0-2-4 wall, 3 free */

  RSS(ref_node_add(ref_node, 0, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 0.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 0.0;
  nodes[0] = node;

  RSS(ref_node_add(ref_node, 1, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 1.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 0.0;
  nodes[1] = node;

  RSS(ref_node_add(ref_node, 2, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 0.0;
  ref_node_xyz(ref_node, 1, node) = 1.0;
  ref_node_xyz(ref_node, 2, node) = 0.0;
  nodes[2] = node;

  RSS(ref_node_add(ref_node, 3, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 1.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 1.0;
  nodes[3] = node;

  *target_node = node;

  RSS(ref_cell_add(ref_grid_tet(ref_grid), nodes, &cell), "add tri");

  nodes[1] = nodes[2];

  RSS(ref_node_add(ref_node, 4, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 0.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 1.0;
  nodes[2] = node;

  *top_node = node;

  RSS(ref_cell_add(ref_grid_tet(ref_grid), nodes, &cell), "add tri");

  return REF_SUCCESS;
}